

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O1

void __thiscall
QPDF::generateHintStream
          (QPDF *this,NewObjTable *new_obj,ObjTable *obj,string *hint_buffer,int *S,int *O,
          bool compressed)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type i;
  QPDF *i_00;
  _Head_base<0UL,_qpdf::pl::Link_*,_false> _Var2;
  Count *this_00;
  size_type *psVar3;
  _Head_base<0UL,_Pipeline_*,_false> next;
  QPDF *this_01;
  BitWriter w;
  string b;
  _Head_base<0UL,_qpdf::pl::Count_*,_false> local_90;
  _Head_base<0UL,_qpdf::pl::Link_*,_false> local_88;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_80;
  BitWriter local_78;
  int *local_60;
  action_e local_54;
  string local_50;
  
  local_60 = S;
  calculateHPageOffset(this,new_obj,obj);
  calculateHSharedObject(this,new_obj,obj);
  calculateHOutline(this,new_obj,obj);
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  if (compressed) {
    ::qpdf::pl::create<qpdf::pl::String,std::__cxx11::string&>((pl *)&local_80,hint_buffer);
    local_54 = a_deflate;
    ::qpdf::pl::create<Pl_Flate,Pl_Flate::action_e>((pl *)&local_88,&local_80,&local_54);
    local_90._M_head_impl = (Count *)operator_new(0x58);
    _Var2._M_head_impl = local_88._M_head_impl;
    local_78.pl = (Pipeline *)local_88._M_head_impl;
    local_88._M_head_impl = (Link *)0x0;
    if ((Pipeline *)_Var2._M_head_impl == (Pipeline *)0x0) {
      next._M_head_impl = (Pipeline *)0x0;
    }
    else {
      next._M_head_impl =
           (((__uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_> *)
            &(((string *)&(_Var2._M_head_impl)->next_pl)->_M_dataplus)._M_p)->_M_t).
           super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
           super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl;
    }
    Pipeline::Pipeline((Pipeline *)local_90._M_head_impl,"",next._M_head_impl);
    ((local_90._M_head_impl)->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Count_002f3298;
    (local_90._M_head_impl)->count = 0;
    (local_90._M_head_impl)->str = &local_50;
    ((local_90._M_head_impl)->link)._M_t.
    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl = (Link *)local_78.pl;
    (local_90._M_head_impl)->id_ = 0;
    (local_90._M_head_impl)->pass_immediately_to_next = false;
  }
  else {
    this_00 = (Count *)operator_new(0x58);
    local_78.pl = (Pipeline *)0x0;
    Pipeline::Pipeline((Pipeline *)this_00,"",(Pipeline *)0x0);
    (this_00->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Count_002f3298;
    this_00->count = 0;
    this_00->str = hint_buffer;
    (this_00->link)._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
    ._M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl = (Link *)local_78.pl;
    this_00->id_ = 0;
    this_00->pass_immediately_to_next = false;
    local_90._M_head_impl = this_00;
  }
  local_78.pl = (Pipeline *)0x0;
  std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
            ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_78);
  if (compressed) {
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
              ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_88);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_80);
  }
  BitWriter::BitWriter(&local_78,&(local_90._M_head_impl)->super_Pipeline);
  writeHPageOffset(this,&local_78);
  psVar3 = (size_type *)&(local_90._M_head_impl)->count;
  if ((local_90._M_head_impl)->str != (string *)0x0) {
    psVar3 = &(local_90._M_head_impl)->str->_M_string_length;
  }
  i = *psVar3;
  if ((long)(int)i != i) {
    QIntC::IntConverter<long_long,_int,_true,_true>::error(i);
  }
  *local_60 = (int)i;
  this_01 = this;
  writeHSharedObject(this,&local_78);
  *O = 0;
  if (0 < *(int *)((long)&((this->m)._M_t.
                           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                           .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                          outline_hints + 0x10)) {
    psVar3 = (size_type *)&(local_90._M_head_impl)->count;
    if ((local_90._M_head_impl)->str != (string *)0x0) {
      psVar3 = &(local_90._M_head_impl)->str->_M_string_length;
    }
    i_00 = (QPDF *)*psVar3;
    if (i_00 + -0x10000000 < (QPDF *)0xffffffff00000000) {
      this_01 = i_00;
      QIntC::IntConverter<long_long,_int,_true,_true>::error((longlong)i_00);
    }
    *O = (int)i_00;
    writeHGeneric(this_01,&local_78,
                  &((this->m)._M_t.
                    super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->outline_hints);
  }
  ::qpdf::pl::Count::finish(local_90._M_head_impl);
  std::unique_ptr<qpdf::pl::Count,_std::default_delete<qpdf::pl::Count>_>::~unique_ptr
            ((unique_ptr<qpdf::pl::Count,_std::default_delete<qpdf::pl::Count>_> *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void
QPDF::generateHintStream(
    QPDFWriter::NewObjTable const& new_obj,
    QPDFWriter::ObjTable const& obj,
    std::string& hint_buffer,
    int& S,
    int& O,
    bool compressed)
{
    // Populate actual hint table values
    calculateHPageOffset(new_obj, obj);
    calculateHSharedObject(new_obj, obj);
    calculateHOutline(new_obj, obj);

    // Write the hint stream itself into a compressed memory buffer. Write through a counter so we
    // can get offsets.
    std::string b;
    auto c = compressed
        ? std::make_unique<pl::Count>(
              0, b, pl::create<Pl_Flate>(pl::create<pl::String>(hint_buffer), Pl_Flate::a_deflate))
        : std::make_unique<pl::Count>(0, hint_buffer);

    BitWriter w(c.get());

    writeHPageOffset(w);
    S = toI(c->getCount());
    writeHSharedObject(w);
    O = 0;
    if (m->outline_hints.nobjects > 0) {
        O = toI(c->getCount());
        writeHGeneric(w, m->outline_hints);
    }
    c->finish();
}